

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetShaderVariableTypeLiteralName
                 (SHADER_RESOURCE_VARIABLE_TYPE VarType,bool bGetFullName)

{
  int iVar1;
  Char *pCVar2;
  bool bGetFullName_local;
  SHADER_RESOURCE_VARIABLE_TYPE VarType_local;
  
  if (GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)::
      VarTypeToLiteralName == '\0') {
    iVar1 = __cxa_guard_acquire(&GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)
                                 ::VarTypeToLiteralName);
    if (iVar1 != 0) {
      GetShaderVariableTypeLiteralName::VarTypeToLiteralNameMap::VarTypeToLiteralNameMap
                (&GetShaderVariableTypeLiteralName::VarTypeToLiteralName);
      __cxa_guard_release(&GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)
                           ::VarTypeToLiteralName);
    }
  }
  pCVar2 = GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)::
           VarTypeToLiteralNameMap::Get(Diligent::SHADER_RESOURCE_VARIABLE_TYPE_bool__const
                     (&GetShaderVariableTypeLiteralName::VarTypeToLiteralName,VarType,bGetFullName);
  return pCVar2;
}

Assistant:

const Char* GetShaderVariableTypeLiteralName(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName)
{
    struct VarTypeToLiteralNameMap
    {
        VarTypeToLiteralNameMap()
        {
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]  = "static";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE] = "mutable";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC] = "dynamic";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]   = "SHADER_RESOURCE_VARIABLE_TYPE_STATIC";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE]  = "SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC]  = "SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC";

            static_assert(SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES == 3, "Not all shader variable types initialized.");
        }

        const Char* Get(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName) const
        {
            if (VarType >= SHADER_RESOURCE_VARIABLE_TYPE_STATIC && VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES)
                return (bGetFullName ? FullVarTypeNameStrings : ShortVarTypeNameStrings)[VarType];
            else
            {
                UNEXPECTED("Unknown shader variable type");
                return "unknown";
            }
        }

    private:
        std::array<const Char*, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES> ShortVarTypeNameStrings{};
        std::array<const Char*, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES> FullVarTypeNameStrings{};
    };

    static const VarTypeToLiteralNameMap VarTypeToLiteralName;
    return VarTypeToLiteralName.Get(VarType, bGetFullName);
}